

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor.h
# Opt level: O0

void __thiscall
hiberlite::ExtractModel::putNamedColumn
          (ExtractModel *this,string *table,string *colname,string *storClass)

{
  bool bVar1;
  mapped_type *pmVar2;
  logic_error *this_00;
  string local_100 [32];
  string local_e0 [32];
  Column local_c0;
  undefined1 local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [48];
  string local_48 [32];
  string *local_28;
  string *storClass_local;
  string *colname_local;
  string *table_local;
  ExtractModel *this_local;
  
  local_28 = storClass;
  storClass_local = colname;
  colname_local = table;
  table_local = (string *)this;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                         *)this,table);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)table);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                         *)this,table);
  std::__cxx11::string::string(local_48,(string *)colname);
  bVar1 = Table::contains(pmVar2,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  if (!bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                           *)this,table);
    std::__cxx11::string::string(local_e0,(string *)colname);
    std::__cxx11::string::string(local_100,(string *)storClass);
    Column::Column(&local_c0,(string *)local_e0,(string *)local_100);
    Table::add(pmVar2,&local_c0);
    Column::~Column(&local_c0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_e0);
    return;
  }
  local_79 = 1;
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(local_78,(char *)colname);
  std::logic_error::logic_error(this_00,(string *)local_78);
  local_79 = 0;
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline void putNamedColumn(std::string table, std::string colname, std::string storClass){
			model[ table ].name=table;
			if( model[table].contains( colname ) )
				throw std::logic_error(colname+": column name is in use");
			model[ table ].add( Column(colname,storClass) );
		}